

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O0

Error * ot::commissioner::utils::Hex(Error *__return_storage_ptr__,ByteArray *aBuf,string *aHexStr)

{
  string *this;
  uint8_t uVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  char *pcVar5;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  basic_string_view<char> bVar6;
  format_args args;
  format_args args_00;
  string_view fmt;
  string_view fmt_00;
  byte local_204 [2];
  anon_class_1_0_00000001 local_202;
  v10 local_201;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_200;
  char *local_1f8;
  string local_1f0;
  ulong local_1d0;
  size_t i;
  anon_class_1_0_00000001 local_1b2;
  v10 local_1b1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1b0;
  char *local_1a8;
  string local_1a0;
  string *local_180;
  string *aHexStr_local;
  ByteArray *aBuf_local;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_168 [2];
  undefined1 local_158 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_148;
  char *local_140;
  string *local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_130;
  char *pcStack_128;
  string *local_120;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_118 [3];
  undefined1 local_100 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_f0;
  char *local_e8;
  string *local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_d8;
  char *pcStack_d0;
  string *local_c8;
  v10 *local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_b8;
  v10 *local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_98;
  char *pcStack_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_78;
  char *pcStack_70;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_68;
  undefined1 *local_60;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_58;
  undefined1 *local_50;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_48;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_40;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_38;
  undefined8 local_30;
  undefined1 *local_28;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_20;
  undefined8 local_18;
  undefined1 *local_10;
  
  local_180 = aHexStr;
  aHexStr_local = (string *)aBuf;
  aBuf_local = (ByteArray *)__return_storage_ptr__;
  uVar3 = std::__cxx11::string::size();
  if ((uVar3 & 1) == 0) {
    for (local_1d0 = 0; uVar3 = local_1d0, uVar4 = std::__cxx11::string::size(), uVar3 < uVar4;
        local_1d0 = local_1d0 + 2) {
      pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)local_180);
      iVar2 = isxdigit((int)*pcVar5);
      if (iVar2 == 0) {
LAB_00211b06:
        Hex::anon_class_1_0_00000001::operator()(&local_202);
        local_a8 = &local_200;
        local_b0 = &local_201;
        bVar6 = ::fmt::v10::operator()(local_b0);
        local_1f8 = (char *)bVar6.size_;
        local_200 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)bVar6.data_
        ;
        ::fmt::v10::detail::
        check_format_string<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_FMT_COMPILE_STRING,_0>
                  ();
        local_130 = local_200;
        pcStack_128 = local_1f8;
        local_138 = local_180;
        local_80 = &local_130;
        local_148 = local_200;
        local_140 = local_1f8;
        local_120 = &local_1f0;
        local_78 = local_148;
        pcStack_70 = local_140;
        local_168[0] = ::fmt::v10::
                       make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,std::__cxx11::string_const>
                                 ((format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   *)local_180,(v10 *)&local_1f0,local_200);
        local_50 = local_158;
        local_58 = local_168;
        local_30 = 0xd;
        args_00.field_1.values_ = in_R9.values_;
        args_00.desc_ = (unsigned_long_long)local_58;
        fmt_00.size_ = 0xd;
        fmt_00.data_ = local_140;
        local_48 = local_58;
        local_38 = local_58;
        local_28 = local_50;
        ::fmt::v10::vformat_abi_cxx11_(&local_1f0,(v10 *)local_148,fmt_00,args_00);
        Error::Error(__return_storage_ptr__,kInvalidArgs,&local_1f0);
        std::__cxx11::string::~string((string *)&local_1f0);
        return __return_storage_ptr__;
      }
      pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)local_180);
      iVar2 = isxdigit((int)*pcVar5);
      this = aHexStr_local;
      if (iVar2 == 0) goto LAB_00211b06;
      pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)local_180);
      uVar1 = Hex(*pcVar5);
      pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)local_180);
      local_204[0] = Hex(*pcVar5);
      local_204[0] = uVar1 << 4 | local_204[0];
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this,local_204);
    }
    Error::Error(__return_storage_ptr__);
  }
  else {
    Hex::anon_class_1_0_00000001::operator()(&local_1b2);
    local_b8 = &local_1b0;
    local_c0 = &local_1b1;
    bVar6 = ::fmt::v10::operator()(local_c0);
    local_1a8 = (char *)bVar6.size_;
    local_1b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)bVar6.data_;
    ::fmt::v10::detail::
    check_format_string<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_FMT_COMPILE_STRING,_0>
              ();
    local_d8 = local_1b0;
    pcStack_d0 = local_1a8;
    local_e0 = local_180;
    local_a0 = &local_d8;
    local_f0 = local_1b0;
    local_e8 = local_1a8;
    local_c8 = &local_1a0;
    local_98 = local_f0;
    pcStack_90 = local_e8;
    local_118[0] = ::fmt::v10::
                   make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,std::__cxx11::string_const>
                             ((format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)local_180,(v10 *)&local_1a0,local_1b0);
    local_60 = local_100;
    local_68 = local_118;
    local_18 = 0xd;
    args.field_1.values_ = in_R9.values_;
    args.desc_ = (unsigned_long_long)local_68;
    fmt.size_ = 0xd;
    fmt.data_ = local_e8;
    local_40 = local_68;
    local_20 = local_68;
    local_10 = local_60;
    ::fmt::v10::vformat_abi_cxx11_(&local_1a0,(v10 *)local_f0,fmt,args);
    Error::Error(__return_storage_ptr__,kInvalidArgs,&local_1a0);
    std::__cxx11::string::~string((string *)&local_1a0);
  }
  return __return_storage_ptr__;
}

Assistant:

Error Hex(ByteArray &aBuf, const std::string &aHexStr)
{
    if (aHexStr.size() % 2 != 0)
    {
        return ERROR_INVALID_ARGS("{} is not a valid HEX string; must have even length", aHexStr);
    }

    for (size_t i = 0; i < aHexStr.size(); i += 2)
    {
        if (!isxdigit(aHexStr[i]) || !isxdigit(aHexStr[i + 1]))
        {
            return ERROR_INVALID_ARGS("{} is not a valid HEX string; there is non-HEX char", aHexStr);
        }
        aBuf.push_back((Hex(aHexStr[i]) << 4) | Hex(aHexStr[i + 1]));
    }
    return ERROR_NONE;
}